

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# neuralnet.cpp
# Opt level: O1

void __thiscall
indk::NeuralNet::doSignalProcessStart
          (NeuralNet *this,
          vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
          *Xx,EntryList *entries)

{
  _Rb_tree_header *p_Var1;
  void *pvVar2;
  undefined8 uVar3;
  _Tuple_impl<4UL,_int> _Var4;
  _Head_base<3UL,_void_*,_false> this_00;
  _Head_base<2UL,_void_*,_false> this_01;
  int iVar5;
  int iVar6;
  iterator iVar7;
  iterator iVar8;
  Computer *pCVar9;
  int64_t tn;
  int64_t iVar10;
  long lVar11;
  bool bVar12;
  vector<float,_std::allocator<float>_> *__x;
  pointer ppVar13;
  _Rb_tree_color _Var14;
  pointer __k;
  _Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_*,_void_*,_int>
  *p_Var15;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_indk::Neuron_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_indk::Neuron_*>_>_>
  *pmVar16;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *we;
  key_type *__k_00;
  float X_00;
  pair<long,_float> pVar17;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  waiting;
  __tuple_element_t<1UL,_tuple<basic_string<char>,_basic_string<char>,_void_*,_void_*,_int>_> to;
  vector<float,_std::allocator<float>_> X;
  undefined1 local_120 [32];
  vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
  *local_100;
  _Base_ptr local_f8;
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_indk::Neuron_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_indk::Neuron_*>_>_>
  *local_f0;
  _Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_*,_void_*,_int>
  *local_e8;
  long local_e0;
  pointer local_d8;
  long *local_d0 [2];
  long local_c0 [2];
  int64_t local_b0;
  vector<float,_std::allocator<float>_> *local_a8;
  EntryList *local_a0;
  vector<float,_std::allocator<float>_> *local_98;
  pointer local_90;
  _Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_*,_void_*,_int>
  local_88;
  
  local_b0 = this->t;
  __x = (Xx->
        super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
        )._M_impl.super__Vector_impl_data._M_start;
  local_a8 = (Xx->
             super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
             )._M_impl.super__Vector_impl_data._M_finish;
  local_100 = Xx;
  local_a0 = entries;
  if (__x != local_a8) {
    local_f0 = &this->Neurons;
    p_Var1 = &(this->Latencies)._M_t._M_impl.super__Rb_tree_header;
    local_f8 = &(this->Neurons)._M_t._M_impl.super__Rb_tree_header._M_header;
    do {
      local_98 = __x;
      std::vector<float,_std::allocator<float>_>::vector
                ((vector<float,_std::allocator<float>_> *)&local_88,__x);
      ppVar13 = (local_a0->
                super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
                )._M_impl.super__Vector_impl_data._M_start;
      local_90 = (local_a0->
                 super__Vector_base<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
                 )._M_impl.super__Vector_impl_data._M_finish;
      if (ppVar13 != local_90) {
        local_e0 = 0;
        do {
          __k = (ppVar13->second).
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
          local_e8 = (_Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_*,_void_*,_int>
                      *)(ppVar13->second).
                        super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ._M_impl.super__Vector_impl_data._M_finish;
          local_d8 = ppVar13;
          if ((_Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_*,_void_*,_int>
               *)__k != local_e8) {
            do {
              iVar7 = std::
                      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_indk::Neuron_*>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_indk::Neuron_*>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_indk::Neuron_*>_>_>
                      ::find(&local_f0->_M_t,__k);
              iVar8 = std::
                      _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                      ::find(&(this->Latencies)._M_t,__k);
              if ((_Rb_tree_header *)iVar8._M_node == p_Var1) {
                _Var14 = _S_red;
              }
              else {
                _Var14 = iVar8._M_node[2]._M_color;
              }
              Neuron::getWaitingEntries_abi_cxx11_
                        ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                          *)local_120,*(Neuron **)(iVar7._M_node + 2));
              uVar3 = local_120._8_8_;
              for (__k_00 = (key_type *)local_120._0_8_; __k_00 != (key_type *)uVar3;
                  __k_00 = __k_00 + 1) {
                iVar8 = std::
                        _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
                        ::find(&(this->Latencies)._M_t,__k_00);
                if (((_Rb_tree_header *)iVar8._M_node != p_Var1) &&
                   ((int)_Var14 < (int)iVar8._M_node[2]._M_color)) {
                  Neuron::doSignalSendEntry(*(Neuron **)(iVar7._M_node + 2),__k_00,0.0,0);
                }
              }
              if (iVar7._M_node != local_f8) {
                Neuron::doSignalSendEntry
                          (*(Neuron **)(iVar7._M_node + 2),&local_d8->first,
                           *(float *)(CONCAT44(local_88.
                                               super__Tuple_impl<1UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_*,_void_*,_int>
                                               .super__Tuple_impl<2UL,_void_*,_void_*,_int>.
                                               super__Tuple_impl<3UL,_void_*,_int>._4_4_,
                                               local_88.
                                               super__Tuple_impl<1UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_*,_void_*,_int>
                                               .super__Tuple_impl<2UL,_void_*,_void_*,_int>.
                                               super__Tuple_impl<3UL,_void_*,_int>.
                                               super__Tuple_impl<4UL,_int>.
                                               super__Head_base<4UL,_int,_false>._M_head_impl) +
                                     local_e0 * 4),this->t);
              }
              std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                         *)local_120);
              __k = __k + 1;
            } while ((_Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_*,_void_*,_int>
                      *)__k != local_e8);
          }
          local_e0 = local_e0 + 1;
          ppVar13 = local_d8 + 1;
        } while (ppVar13 != local_90);
      }
      this->t = this->t + 1;
      pvVar2 = (void *)CONCAT44(local_88.
                                super__Tuple_impl<1UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_*,_void_*,_int>
                                .super__Tuple_impl<2UL,_void_*,_void_*,_int>.
                                super__Tuple_impl<3UL,_void_*,_int>._4_4_,
                                local_88.
                                super__Tuple_impl<1UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_*,_void_*,_int>
                                .super__Tuple_impl<2UL,_void_*,_void_*,_int>.
                                super__Tuple_impl<3UL,_void_*,_int>.super__Tuple_impl<4UL,_int>.
                                super__Head_base<4UL,_int,_false>._M_head_impl);
      if (pvVar2 != (void *)0x0) {
        operator_delete(pvVar2,(long)local_88.
                                     super__Tuple_impl<1UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_*,_void_*,_int>
                                     .super__Tuple_impl<2UL,_void_*,_void_*,_int>.
                                     super__Head_base<2UL,_void_*,_false>._M_head_impl -
                               (long)pvVar2);
      }
      __x = local_98 + 1;
    } while (__x != local_a8);
  }
  iVar5 = System::getComputeBackendKind();
  if (iVar5 == 2) {
    pCVar9 = System::getComputeBackend();
    (*pCVar9->_vptr_Computer[2])(pCVar9);
  }
  local_f8 = (_Base_ptr)(undefined1 *)0x1;
  if ((local_100->
      super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
      )._M_impl.super__Vector_impl_data._M_start !=
      (local_100->
      super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
      )._M_impl.super__Vector_impl_data._M_finish) {
    local_f8 = (_Base_ptr)(this->t - local_b0);
  }
  if (local_f8 != (_Base_ptr)0x0) {
    pmVar16 = (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_indk::Neuron_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_indk::Neuron_*>_>_>
               *)0x0;
    do {
      p_Var15 = &((this->Links).
                  super__Vector_base<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_*,_void_*,_int>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_*,_void_*,_int>_>_>
                  ._M_impl.super__Vector_impl_data._M_start)->
                 super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_*,_void_*,_int>
      ;
      local_e8 = &((this->Links).
                   super__Vector_base<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_*,_void_*,_int>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_*,_void_*,_int>_>_>
                   ._M_impl.super__Vector_impl_data._M_finish)->
                  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_*,_void_*,_int>
      ;
      if (p_Var15 == local_e8) {
        lVar11 = 0;
      }
      else {
        iVar5 = 0;
        local_f0 = pmVar16;
        do {
          std::
          _Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_*,_void_*,_int>
          ::_Tuple_impl(&local_88,p_Var15);
          local_120._0_8_ = (key_type *)(local_120 + 0x10);
          std::__cxx11::string::_M_construct<char*>
                    ((string *)local_120,
                     local_88.
                     super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
                     ._M_head_impl._M_dataplus._M_p,
                     local_88.
                     super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
                     ._M_head_impl._M_dataplus._M_p +
                     local_88.
                     super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
                     ._M_head_impl._M_string_length);
          local_d0[0] = local_c0;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)local_d0,
                     local_88.
                     super__Tuple_impl<1UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_*,_void_*,_int>
                     .
                     super__Head_base<1UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
                     ._M_head_impl._M_dataplus._M_p,
                     local_88.
                     super__Tuple_impl<1UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_*,_void_*,_int>
                     .
                     super__Head_base<1UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
                     ._M_head_impl._M_dataplus._M_p +
                     local_88.
                     super__Tuple_impl<1UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_*,_void_*,_int>
                     .
                     super__Head_base<1UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
                     ._M_head_impl._M_string_length);
          this_01._M_head_impl =
               local_88.
               super__Tuple_impl<1UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_*,_void_*,_int>
               .super__Tuple_impl<2UL,_void_*,_void_*,_int>.super__Head_base<2UL,_void_*,_false>.
               _M_head_impl;
          this_00._M_head_impl =
               local_88.
               super__Tuple_impl<1UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_*,_void_*,_int>
               .super__Tuple_impl<2UL,_void_*,_void_*,_int>.super__Tuple_impl<3UL,_void_*,_int>.
               super__Head_base<3UL,_void_*,_false>._M_head_impl;
          _Var4.super__Head_base<4UL,_int,_false>._M_head_impl =
               local_88.
               super__Tuple_impl<1UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_*,_void_*,_int>
               .super__Tuple_impl<2UL,_void_*,_void_*,_int>.super__Tuple_impl<3UL,_void_*,_int>.
               super__Tuple_impl<4UL,_int>.super__Head_base<4UL,_int,_false>._M_head_impl;
          tn = Neuron::getTime((Neuron *)
                               local_88.
                               super__Tuple_impl<1UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_*,_void_*,_int>
                               .super__Tuple_impl<2UL,_void_*,_void_*,_int>.
                               super__Tuple_impl<3UL,_void_*,_int>.
                               super__Head_base<3UL,_void_*,_false>._M_head_impl);
          iVar10 = Neuron::getTime((Neuron *)this_00._M_head_impl);
          if (iVar10 == this->t) {
            iVar5 = iVar5 + 1;
          }
          else {
            X_00 = 0.0;
            if (tn != 0 || -1 < (int)_Var4.super__Head_base<4UL,_int,_false>._M_head_impl) {
              lVar11 = tn - (ulong)((uint)_Var4.super__Head_base<4UL,_int,_false>._M_head_impl >>
                                   0x1f);
              iVar6 = Neuron::getState((Neuron *)this_01._M_head_impl,lVar11);
              if (iVar6 != 2) {
                iVar6 = System::getComputeBackendKind();
                iVar5 = iVar5 + (uint)(iVar6 == 2);
                goto LAB_001172db;
              }
              pVar17 = Neuron::doSignalReceive((Neuron *)this_01._M_head_impl,lVar11);
              X_00 = pVar17.second;
            }
            Neuron::doSignalSendEntry((Neuron *)this_00._M_head_impl,(string *)local_120,X_00,tn);
            iVar6 = System::getComputeBackendKind();
            if (iVar6 == 2) {
              bVar12 = tn == this->t ||
                       (local_100->
                       super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                       )._M_impl.super__Vector_impl_data._M_start !=
                       (local_100->
                       super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                       )._M_impl.super__Vector_impl_data._M_finish;
            }
            else {
              bVar12 = tn == this->t;
            }
            iVar5 = iVar5 + (uint)bVar12;
          }
LAB_001172db:
          if (local_d0[0] != local_c0) {
            operator_delete(local_d0[0],local_c0[0] + 1);
          }
          if ((key_type *)local_120._0_8_ != (key_type *)(local_120 + 0x10)) {
            operator_delete((void *)local_120._0_8_,(ulong)(local_120._16_8_ + 1));
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_88.
                 super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
                 ._M_head_impl._M_dataplus._M_p !=
              &local_88.
               super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
               ._M_head_impl.field_2) {
            operator_delete(local_88.
                            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
                            ._M_head_impl._M_dataplus._M_p,
                            local_88.
                            super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
                            ._M_head_impl.field_2._M_allocated_capacity + 1);
          }
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)local_88.
                 super__Tuple_impl<1UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_*,_void_*,_int>
                 .
                 super__Head_base<1UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
                 ._M_head_impl._M_dataplus._M_p !=
              &local_88.
               super__Tuple_impl<1UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_*,_void_*,_int>
               .
               super__Head_base<1UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
               ._M_head_impl.field_2) {
            operator_delete(local_88.
                            super__Tuple_impl<1UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_*,_void_*,_int>
                            .
                            super__Head_base<1UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
                            ._M_head_impl._M_dataplus._M_p,
                            local_88.
                            super__Tuple_impl<1UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_*,_void_*,_int>
                            .
                            super__Head_base<1UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_false>
                            ._M_head_impl.field_2._M_allocated_capacity + 1);
          }
          p_Var15 = p_Var15 + 1;
        } while (p_Var15 != local_e8);
        lVar11 = (long)iVar5;
        pmVar16 = local_f0;
      }
      if (((long)(this->Links).
                 super__Vector_base<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_*,_void_*,_int>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_*,_void_*,_int>_>_>
                 ._M_impl.super__Vector_impl_data._M_finish -
           (long)(this->Links).
                 super__Vector_base<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_*,_void_*,_int>,_std::allocator<std::tuple<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_void_*,_void_*,_int>_>_>
                 ._M_impl.super__Vector_impl_data._M_start >> 3) * 0x2e8ba2e8ba2e8ba3 - lVar11 == 0)
      {
        pmVar16 = (map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_indk::Neuron_*,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_indk::Neuron_*>_>_>
                   *)&(pmVar16->_M_t)._M_impl.field_0x1;
      }
      else if ((local_100->
               super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
               )._M_impl.super__Vector_impl_data._M_start ==
               (local_100->
               super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
               )._M_impl.super__Vector_impl_data._M_finish) {
        pCVar9 = System::getComputeBackend();
        (*pCVar9->_vptr_Computer[2])(pCVar9);
      }
    } while ((_Base_ptr)pmVar16 != local_f8);
  }
  return;
}

Assistant:

void indk::NeuralNet::doSignalProcessStart(const std::vector<std::vector<float>>& Xx, const EntryList& entries) {
    float value;
    int d = 0;

    int64_t dt = t;

    for (auto X: Xx) {
        int xi = 0;
        for (auto &e: entries) {
            for (auto &en: e.second) {
                auto n = Neurons.find(en);

                auto lto = Latencies.find(en);
                auto latencyto = lto != Latencies.end() ? lto->second : 0;
                auto waiting = n -> second -> getWaitingEntries();
                for (auto &we: waiting) {
                    auto nprev = Latencies.find(we);
                    if (nprev != Latencies.end() && nprev->second > latencyto) {
                        n -> second -> doSignalSendEntry(we, 0, 0);
                    }
                }

                if (n != Neurons.end())
                    n -> second -> doSignalSendEntry(e.first, X[xi], t);
            }
            xi++;
        }
        t++;
    }

    if (indk::System::getComputeBackendKind() == indk::System::ComputeBackends::OpenCL)
        indk::System::getComputeBackend() -> doWaitTarget();

    dt = t - dt;
    if (Xx.empty()) dt = 1;
    int64_t lt = 0;

    while (lt != dt) {
        d = 0;

        for (auto l: Links) {
            auto from = std::get<0>(l);
            auto to = std::get<1>(l);

            auto nfrom = (indk::Neuron*)std::get<2>(l);
            auto nto = (indk::Neuron*)std::get<3>(l);
            auto latency = std::get<4>(l);
            auto time = nto -> getTime();

            if (nto->getTime() == t) {
                d++;
                continue;
            }

            value = 0;
            if (!time && latency >= 0 || time) {
                auto shift = (bool)latency;
                if (latency > 0) shift = false;
                if (nfrom->getState(time-shift) != indk::Neuron::States::Computed) {
                    if (indk::System::getComputeBackendKind() == indk::System::ComputeBackends::OpenCL)
                        d++;
                    continue;
                }
                value = nfrom -> doSignalReceive(time-shift).second;
            }


            nto -> doSignalSendEntry(from, value, time);

            if (indk::System::getComputeBackendKind() == indk::System::ComputeBackends::OpenCL) {
                if (!Xx.empty() || Xx.empty() && time == t) {
                    d++;
                }
            } else if (time == t) {
                d++;
            }
        }

        if (d == Links.size()) {
            lt++;
        } else if (Xx.empty()) indk::System::getComputeBackend() -> doWaitTarget();
    }
}